

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O0

void __thiscall BamTools::Internal::BamToolsIndex::~BamToolsIndex(BamToolsIndex *this)

{
  BamToolsIndex *in_RDI;
  vector<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
  *unaff_retaddr;
  
  (in_RDI->super_BamIndex)._vptr_BamIndex = (_func_int **)&PTR__BamToolsIndex_002108d8;
  CloseFile(in_RDI);
  RaiiWrapper::~RaiiWrapper((RaiiWrapper *)in_RDI);
  std::
  vector<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
  ::~vector(unaff_retaddr);
  BamIndex::~BamIndex((BamIndex *)0x1c37de);
  return;
}

Assistant:

BamToolsIndex::~BamToolsIndex(void) {
    CloseFile();
}